

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS
ref_facelift_create(REF_FACELIFT *ref_facelift_ptr,REF_GRID freeable_ref_grid,REF_BOOL direct)

{
  int iVar1;
  REF_FACELIFT pRVar2;
  REF_DBL *pRVar3;
  REF_BOOL *pRVar4;
  int local_3c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_INT n;
  REF_FACELIFT ref_facelift;
  REF_BOOL direct_local;
  REF_GRID freeable_ref_grid_local;
  REF_FACELIFT *ref_facelift_ptr_local;
  
  pRVar2 = (REF_FACELIFT)malloc(0x38);
  *ref_facelift_ptr = pRVar2;
  if (*ref_facelift_ptr == (REF_FACELIFT)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",0x79
           ,"ref_facelift_create","malloc *ref_facelift_ptr of REF_FACELIFT_STRUCT NULL");
    return 2;
  }
  pRVar2 = *ref_facelift_ptr;
  pRVar2->grid = freeable_ref_grid;
  pRVar2->edg_cell = pRVar2->grid->cell[0];
  pRVar2->tri_cell = pRVar2->grid->cell[3];
  if (0 < pRVar2->grid->cell[1]->n) {
    pRVar2->edg_cell = pRVar2->grid->cell[1];
  }
  if (0 < pRVar2->grid->cell[2]->n) {
    pRVar2->edg_cell = pRVar2->grid->cell[2];
  }
  if (0 < pRVar2->grid->cell[4]->n) {
    pRVar2->tri_cell = pRVar2->grid->cell[4];
  }
  if (0 < pRVar2->grid->cell[5]->n) {
    pRVar2->tri_cell = pRVar2->grid->cell[5];
  }
  if (direct == 0) {
    iVar1 = pRVar2->grid->geom->max;
    if (iVar1 * 3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x9a,"ref_facelift_create","malloc ref_facelift->displacement of REF_DBL negative");
      return 1;
    }
    pRVar3 = (REF_DBL *)malloc((long)(iVar1 * 3) << 3);
    pRVar2->displacement = pRVar3;
    if (pRVar2->displacement == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x9a,"ref_facelift_create","malloc ref_facelift->displacement of REF_DBL NULL");
      return 2;
    }
    for (ref_private_macro_code_rss = 0;
        SBORROW4(ref_private_macro_code_rss,iVar1 * 3) !=
        ref_private_macro_code_rss + iVar1 * -3 < 0;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      pRVar2->displacement[ref_private_macro_code_rss] = 0.0;
    }
    if (iVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x9b,"ref_facelift_create","malloc ref_facelift->strong_bc of REF_BOOL negative");
      return 1;
    }
    pRVar4 = (REF_BOOL *)malloc((long)iVar1 << 2);
    pRVar2->strong_bc = pRVar4;
    if (pRVar2->strong_bc == (REF_BOOL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x9b,"ref_facelift_create","malloc ref_facelift->strong_bc of REF_BOOL NULL");
      return 2;
    }
    for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
      pRVar2->strong_bc[local_3c] = 0;
    }
  }
  else {
    pRVar2->displacement = (REF_DBL *)0x0;
    pRVar2->strong_bc = (REF_BOOL *)0x0;
  }
  ref_facelift_ptr_local._4_4_ = ref_facelift_cache_search(pRVar2);
  if (ref_facelift_ptr_local._4_4_ == 0) {
    ref_facelift_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",0x9e
           ,"ref_facelift_create",(ulong)ref_facelift_ptr_local._4_4_,"cache tri uv");
  }
  return ref_facelift_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_create(REF_FACELIFT *ref_facelift_ptr,
                                       REF_GRID freeable_ref_grid,
                                       REF_BOOL direct) {
  REF_FACELIFT ref_facelift;
  REF_INT n;

  ref_malloc(*ref_facelift_ptr, 1, REF_FACELIFT_STRUCT);

  ref_facelift = *ref_facelift_ptr;

  ref_facelift_grid(ref_facelift) = freeable_ref_grid;

  ref_facelift_edg(ref_facelift) =
      ref_grid_edg(ref_facelift_grid(ref_facelift));
  ref_facelift_tri(ref_facelift) =
      ref_grid_tri(ref_facelift_grid(ref_facelift));

  if (ref_cell_n(ref_grid_ed2(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_edg(ref_facelift) =
        ref_grid_ed2(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_ed3(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_edg(ref_facelift) =
        ref_grid_ed3(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_tr2(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_tri(ref_facelift) =
        ref_grid_tr2(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_tr3(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_tri(ref_facelift) =
        ref_grid_tr3(ref_facelift_grid(ref_facelift));
  }

  if (direct) {
    ref_facelift->displacement = NULL;
    ref_facelift->strong_bc = NULL;
  } else {
    n = ref_geom_max(ref_facelift_geom(ref_facelift));
    ref_malloc_init(ref_facelift->displacement, 3 * n, REF_DBL, 0.0);
    ref_malloc_init(ref_facelift->strong_bc, n, REF_BOOL, REF_FALSE);
  }

  RSS(ref_facelift_cache_search(ref_facelift), "cache tri uv");

  return REF_SUCCESS;
}